

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_parseInt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pc;
  JSValue JVar3;
  int radix;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  pc = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (pc == (char *)0x0) {
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    piVar1 = (int *)argv[1].u.ptr;
    JVar3 = argv[1];
    if (0xfffffff4 < (uint)argv[1].tag) {
      *piVar1 = *piVar1 + 1;
    }
    iVar2 = JS_ToInt32Free(ctx,&local_24,JVar3);
    if (iVar2 == 0) {
      if (local_24 == 0 || 0xffffffdc < local_24 - 0x25U) {
        iVar2 = skip_spaces(pc);
        JVar3 = js_atof(ctx,pc + iVar2,(char **)0x0,local_24,0x401);
      }
      else {
        JVar3.tag = 7;
        JVar3.u.float64 = NAN;
      }
    }
    else {
      JVar3 = (JSValue)(ZEXT816(6) << 0x40);
    }
    JS_FreeCString(ctx,pc);
  }
  return JVar3;
}

Assistant:

static JSValue js_parseInt(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *str, *p;
    int radix, flags;
    JSValue ret;

    str = JS_ToCString(ctx, argv[0]);
    if (!str)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &radix, argv[1])) {
        JS_FreeCString(ctx, str);
        return JS_EXCEPTION;
    }
    if (radix != 0 && (radix < 2 || radix > 36)) {
        ret = JS_NAN;
    } else {
        p = str;
        p += skip_spaces(p);
        flags = ATOD_INT_ONLY | ATOD_ACCEPT_PREFIX_AFTER_SIGN;
        ret = js_atof(ctx, p, NULL, radix, flags);
    }
    JS_FreeCString(ctx, str);
    return ret;
}